

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O0

GeneralizedMAAStarPlannerForDecPOMDPDiscrete *
GetGMAAInstance(DecPOMDPDiscreteInterface *decpomdp,Arguments *args,
               PlanningUnitMADPDiscreteParameters *params,string *filename,
               BGIP_SolverCreatorInterface *bgipsc_p)

{
  ulong uVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  PlanningUnitMADPDiscreteParameters *in_RDX;
  int *in_RSI;
  DecPOMDPDiscreteInterface *in_RDI;
  BGIP_SolverCreatorInterface *in_R8;
  string bgFilename;
  GMAA_kGMAACluster *gmaaCluster;
  int verboseness;
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete *gmaa;
  BGClusterAlgorithm in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  GeneralizedMAAStarPlanner *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  E *in_stack_fffffffffffffee0;
  string local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_58 [36];
  int local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  BGIP_SolverCreatorInterface *local_28;
  PlanningUnitMADPDiscreteParameters *local_18;
  int *local_10;
  DecPOMDPDiscreteInterface *local_8;
  
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_34 = *in_RSI;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RSI[0x32] == 0) {
    switch(in_RSI[0x28]) {
    case 0:
      uVar1 = (**(code **)(*(long *)in_R8 + 0x28))();
      if ((uVar1 & 1) == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Error: MAAstar requires an exact BG solver, and ");
        (**(code **)(*(long *)local_28 + 0x20))();
        poVar2 = std::operator<<(poVar2,local_90);
        poVar2 = std::operator<<(poVar2," is not");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_90);
        exit(1);
      }
      in_stack_fffffffffffffed8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x448);
      GMAA_MAAstar::GMAA_MAAstar
                ((GMAA_MAAstar *)in_stack_fffffffffffffed8,local_28,(long)local_10[0x1e],local_8,
                 local_18,local_34);
      local_30 = in_stack_fffffffffffffed8;
      break;
    case 2:
      in_RSI[0x29] = 1;
    case 1:
      in_stack_fffffffffffffed0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x448);
      GMAA_kGMAA::GMAA_kGMAA
                ((GMAA_kGMAA *)in_stack_fffffffffffffed0,local_28,(long)local_10[0x1e],local_8,
                 local_18,(long)local_10[0x29]);
      local_30 = in_stack_fffffffffffffed0;
      break;
    case 3:
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x440);
      GMAA_MAAstarClassic::GMAA_MAAstarClassic
                ((GMAA_MAAstarClassic *)pbVar3,(long)local_10[0x1e],local_8,local_18,local_34);
      local_30 = pbVar3;
      break;
    default:
      uVar4 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      __cxa_throw(uVar4,&E::typeinfo,E::~E);
    }
  }
  else {
    switch(in_RSI[0x28]) {
    case 0:
      uVar1 = (**(code **)(*(long *)in_R8 + 0x28))();
      if ((uVar1 & 1) == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Error: MAAstar requires an exact BG solver, and ");
        (**(code **)(*(long *)local_28 + 0x20))();
        poVar2 = std::operator<<(poVar2,local_58);
        poVar2 = std::operator<<(poVar2," is not");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_58);
        exit(1);
      }
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x490);
      GMAA_MAAstarCluster::GMAA_MAAstarCluster
                ((GMAA_MAAstarCluster *)pbVar3,local_28,(long)local_10[0x1e],local_8,local_18,
                 local_34);
      local_30 = pbVar3;
      break;
    case 2:
      in_RSI[0x29] = 1;
    case 1:
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x4c0);
      in_stack_fffffffffffffea8 = local_10[0x33];
      GMAA_kGMAACluster::GMAA_kGMAACluster
                ((GMAA_kGMAACluster *)pbVar3,local_28,(long)local_10[0x1e],local_8,local_18,
                 (long)local_10[0x29],in_stack_fffffffffffffea8);
      local_70 = pbVar3;
      GMAA_kGMAACluster::SetTresholdJB((GMAA_kGMAACluster *)pbVar3,*(double *)(local_10 + 0x34));
      GMAA_kGMAACluster::SetTresholdPjaoh
                ((GMAA_kGMAACluster *)local_70,*(double *)(local_10 + 0x36));
      local_30 = local_70;
      break;
    case 3:
      uVar4 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      __cxa_throw(uVar4,&E::typeinfo,E::~E);
    default:
      uVar4 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      __cxa_throw(uVar4,&E::typeinfo,E::~E);
    }
  }
  if ((local_10[0x12] == 0) && (local_10[0x2a] != 0)) {
    std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    GeneralizedMAAStarPlanner::SetSaveAllBGs
              (in_stack_fffffffffffffeb0,
               (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string(local_b0);
  }
  GeneralizedMAAStarPlanner::SetVerbose((int)local_30 + 0x338);
  if (*(long *)(local_10 + 0x30) != 0) {
    GeneralizedMAAStarPlanner::SetDeadline((ulong)((long)&local_30[0x19].field_2 + 8));
  }
  return (GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)local_30;
}

Assistant:

GeneralizedMAAStarPlannerForDecPOMDPDiscrete* GetGMAAInstance(
    DecPOMDPDiscreteInterface* decpomdp,
    ArgumentHandlers::Arguments &args,
    const PlanningUnitMADPDiscreteParameters &params,
    const string &filename,
    BGIP_SolverCreatorInterface * bgipsc_p
    )
{
    GeneralizedMAAStarPlannerForDecPOMDPDiscrete *gmaa=0;

    int verboseness = args.verbose;
    if(args.useBGclustering)
    {
        switch(args.gmaa)
        {
        case MAAstar:
            if(!bgipsc_p->IsExactSolver())
            {
                cout << "Error: MAAstar requires an exact BG solver, and " <<
                    bgipsc_p->SoftPrintBrief() << " is not" << endl;
                exit(1);
            }
            gmaa=new GMAA_MAAstarCluster(bgipsc_p, args.horizon, decpomdp, &params, verboseness );
            break;
        case FSPC:
            args.k=1; // fall through on purpose
        case kGMAA:
        {
            GMAA_kGMAACluster *gmaaCluster=
                new GMAA_kGMAACluster(bgipsc_p, args.horizon, decpomdp, &params, args.k,
                                      static_cast<BayesianGameWithClusterInfo::BGClusterAlgorithm>(args.BGClusterAlgorithm));
            gmaaCluster->SetTresholdJB(args.thresholdJB);
            gmaaCluster->SetTresholdPjaoh(args.thresholdPjaoh);
            gmaa=gmaaCluster;
            break;
        }
        case MAAstarClassic:
            throw E("MAAstarClassic not implemented for clustered version");
            break;
        default:
            throw E("unrecognized GMAA type?!");
        }
    }
    else // regular, un-clustered BGs
    {
        switch(args.gmaa)
        {
        case MAAstar:
            if(!bgipsc_p->IsExactSolver())
            {
                cout << "Error: MAAstar requires an exact BG solver, and " <<
                    bgipsc_p->SoftPrintBrief() << " is not" << endl;
                exit(1);
            }
            gmaa=new GMAA_MAAstar(bgipsc_p, args.horizon, decpomdp, &params, verboseness );
            break;
        case FSPC:
            args.k=1; // fall through on purpose
        case kGMAA:
            gmaa=new GMAA_kGMAA(bgipsc_p, args.horizon, decpomdp, &params, args.k);
            break;
        case MAAstarClassic:
            gmaa=new GMAA_MAAstarClassic(args.horizon, decpomdp, &params, verboseness );
            break;
        default:
            throw E("unrecognized GMAA type?!");
        }
    }

    if(!args.dryrun)
    {
#if 0 // don't store this stuff every iteration, the files can get
      // very large and will slow down the execution!
        // instead we do it when an exception is thrown (but might not
        // work when running out of memory)
        if(args.saveTimings)
            gmaa->SetIntermediateTimingFilename(timingsFilename);
        if(dynamic_cast<GMAA_MAAstarCluster*>(gmaa))
            static_cast<GMAA_MAAstarCluster*>(gmaa)->
                SetClusterStatsFilename(filename + "_clusterStats");

#endif
        if(args.saveAllBGs)
        {
            string bgFilename=filename + "_BG";
            gmaa->SetSaveAllBGs(bgFilename);
        }
    }
    
    gmaa->SetVerbose(args.verbose);
    if(args.GMAAdeadline)
        gmaa->SetDeadline(args.GMAAdeadline);

    return(gmaa);
}